

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O0

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Return *return_stmt)

{
  int iVar1;
  ostream *poVar2;
  element_type *peVar3;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  Return *local_18;
  Return *return_stmt_local;
  AstDumper *this_local;
  
  this->spaces_ = this->spaces_ + 2;
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  local_18 = return_stmt;
  return_stmt_local = (Return *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,(long)iVar1,' ',&local_39);
  poVar2 = std::operator<<(poVar2,local_38);
  std::operator<<(poVar2,"<return>\n");
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  peVar3 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_18->expr_);
  (*peVar3->_vptr_Expr[1])(peVar3,this);
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,(long)iVar1,' ',&local_71);
  poVar2 = std::operator<<(poVar2,local_70);
  std::operator<<(poVar2,"</return>\n");
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Return& return_stmt) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<return>\n";
  return_stmt.expr_->Accept(*this);
  out_ << std::string(spaces_, ' ') << "</return>\n";
  spaces_ -= TAB_SIZE;
  return 0;
}